

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O2

void __thiscall
anon_unknown.dwarf_6c9820::TransformSelectorRegex::~TransformSelectorRegex
          (TransformSelectorRegex *this)

{
  ~TransformSelectorRegex(this);
  operator_delete(this,0xf8);
  return;
}

Assistant:

TransformSelectorRegex(const std::string& regex)
    : TransformSelector("REGEX")
    , Regex(regex)
  {
  }